

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int *value)

{
  int *piVar1;
  char cVar2;
  uint __val;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  uint64_t pos;
  StreamReader *pSVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  _Alloc_hider _Var14;
  int iVar15;
  uint uVar16;
  uint __len;
  char sc;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string __str;
  string fp_str;
  ostringstream ss_e;
  stringstream ss;
  char local_399;
  undefined1 local_398 [32];
  byte local_378;
  string local_370;
  string local_350;
  _Alloc_hider local_330;
  ulong local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pos = CurrLoc(this);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  bVar3 = LexFloat(this,&local_350);
  if (bVar3) {
    anon_unknown_3::ParseDouble
              ((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&((anon_union_32_2_293c120a_for_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                     *)local_398)->m_error,(anon_unknown_3 *)local_350._M_dataplus._M_p,
               (string *)local_350._M_string_length);
    bVar12 = local_378;
    if (local_378 == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                 ,0x5f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"ReadBasicType",0xd);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_330,0x326);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"Failed to parse floating value.",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
      ::std::ios_base::~ios_base(local_2c0);
    }
    else {
      *value = (int)(double)local_398._0_8_;
    }
    if (((local_378 & 1) == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._0_8_ !=
        &(((anon_union_32_2_293c120a_for_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
            *)local_398)->m_error).field_2)) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
    }
    goto LAB_003d594c;
  }
  SeekTo(this,pos);
  bVar3 = Char1(this,&local_399);
  if (bVar3) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    bVar3 = true;
    if ((local_399 == '+') || (local_399 == '-')) {
LAB_003d52b3:
      local_330._M_p._0_1_ = local_399;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
      pSVar6 = this->_sr;
      uVar11 = pSVar6->idx_;
      if (uVar11 < pSVar6->length_) {
        while (pSVar6->binary_[uVar11] != '\0') {
          bVar4 = Char1(this,(char *)local_398);
          if (!bVar4) goto LAB_003d55c4;
          if (9 < (byte)(local_398[0] - 0x30)) {
            pSVar6 = this->_sr;
            if ((0 < (long)pSVar6->idx_) && (uVar11 = pSVar6->idx_ - 1, uVar11 <= pSVar6->length_))
            {
              pSVar6->idx_ = uVar11;
            }
            break;
          }
          local_330._M_p._0_1_ = local_398[0];
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
          pSVar6 = this->_sr;
          uVar11 = pSVar6->idx_;
          if (pSVar6->length_ <= uVar11) break;
        }
      }
      if (bVar3) {
        ::std::__cxx11::stringbuf::str();
        uVar11 = local_328;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != local_320) {
          operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
        }
        if (uVar11 == 1) {
          local_330._M_p = (pointer)local_320;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_330,"Integer value expected but got sign character only.\n",""
                    );
          PushError(this,(string *)&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_p != local_320) {
            operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
          }
LAB_003d55c4:
          bVar12 = 0;
          goto LAB_003d594c;
        }
      }
      ::std::__cxx11::stringbuf::str();
      if (local_328 < 2) {
        bVar3 = false;
      }
      else {
        ::std::__cxx11::stringbuf::str();
        bVar3 = *(char *)local_398._0_8_ == '0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            &(((anon_union_32_2_293c120a_for_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_398)->m_error).field_2) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != local_320) {
        operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        ::std::__cxx11::stringbuf::str();
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_330._M_p ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) || (cVar2 = *local_330._M_p, cVar2 == '\0')) {
LAB_003d56d8:
          iVar15 = -1;
        }
        else {
          if ((cVar2 == '-') || (cVar2 == '+')) {
            uVar11 = 1;
            if (local_328 == 1) goto LAB_003d56d8;
          }
          else {
            uVar11 = 0;
          }
          iVar15 = 0;
          if (uVar11 < local_328) {
            lVar13 = 0;
            do {
              if (9 < (byte)(local_330._M_p[uVar11] - 0x30U)) goto LAB_003d56d8;
              lVar13 = (ulong)(byte)(local_330._M_p[uVar11] - 0x30U) + lVar13 * 10;
              if (cVar2 == '-') {
                if (0x80000000 < lVar13) {
                  iVar15 = -3;
                  break;
                }
              }
              else if (0x7fffffff < lVar13) {
                iVar15 = -2;
                break;
              }
              uVar11 = uVar11 + 1;
            } while (local_328 != uVar11);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != local_320) {
          operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
        }
        uVar5 = (*(code *)(&DAT_0041fe20 + *(int *)(&DAT_0041fe20 + (ulong)(iVar15 + 3) * 4)))();
        return (bool)uVar5;
      }
      local_330._M_p = (pointer)local_320;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_330,"Zero padded integer value is not allowed.\n","");
      PushError(this,(string *)&local_330);
      local_370.field_2._M_allocated_capacity = local_320[0]._M_allocated_capacity;
      _Var14._M_p = local_330._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p == local_320) goto LAB_003d594a;
    }
    else {
      if ((byte)(local_399 - 0x30U) < 10) {
        bVar3 = false;
        goto LAB_003d52b3;
      }
      uVar16 = (uint)local_399;
      __val = -uVar16;
      if (0 < (int)uVar16) {
        __val = uVar16;
      }
      __len = 1;
      if (9 < __val) {
        __len = 3 - (__val < 100);
      }
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_370,(char)__len - (local_399 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_370._M_dataplus._M_p + (uVar16 >> 0x1f),__len,__val);
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0x4200e8);
      plVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar9) {
        local_398._16_8_ = *plVar9;
        local_398._24_8_ = puVar8[3];
        local_398._0_8_ =
             &(((anon_union_32_2_293c120a_for_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                 *)local_398)->m_error).field_2;
      }
      else {
        local_398._16_8_ = *plVar9;
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_398._8_8_ = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)local_398);
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_320[0]._0_8_ = *psVar10;
        local_320[0]._8_8_ = puVar8[3];
        local_330._M_p = (pointer)local_320;
      }
      else {
        local_320[0]._0_8_ = *psVar10;
        local_330._M_p = (pointer)*puVar8;
      }
      local_328 = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      PushError(this,(string *)&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != local_320) {
        operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          &(((anon_union_32_2_293c120a_for_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
              *)local_398)->m_error).field_2) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      _Var14._M_p = local_370._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p == &local_370.field_2) goto LAB_003d594a;
    }
    operator_delete(_Var14._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
LAB_003d594a:
  bVar12 = 0;
LAB_003d594c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT71(local_350.field_2._M_allocated_capacity._1_7_,
                             local_350.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (bool)bVar12;
}

Assistant:

bool AsciiParser::ReadBasicType(int *value) {
  std::stringstream ss;

  // pxrUSD allow floating-point value to `int` type.
  // so first try fp parsing.
  auto loc = CurrLoc();
  std::string fp_str;
  if (LexFloat(&fp_str)) {
    auto flt = ParseDouble(fp_str);
    if (!flt) {
      PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
    } else {
      (*value) = int(flt.value());
      return true;
    }
  }

  // revert
  SeekTo(loc);

  // head character
  bool has_sign = false;
  // bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      // negative = false;
      has_sign = true;
    } else if (sc == '-') {
      // negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  int int_value;
  int err = parseInt(ss.str(), &int_value);
  if (err != 0) {
    if (err == -1) {
      PushError("Invalid integer input: `" + ss.str() + "`\n");
      return false;
    } else if (err == -2) {
      PushError("Integer overflows: `" + ss.str() + "`\n");
      return false;
    } else if (err == -3) {
      PushError("Integer underflows: `" + ss.str() + "`\n");
      return false;
    } else {
      PushError("Unknown parseInt error.\n");
      return false;
    }
  }

  (*value) = int_value;

  return true;
}